

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O0

bool __thiscall
cmCMakePolicyCommand::HandleVersionMode
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  size_type sVar1;
  const_reference pvVar2;
  long lVar3;
  ulong uVar4;
  ostream *poVar5;
  string local_268;
  undefined1 local_248 [8];
  ostringstream e;
  undefined1 local_d0 [8];
  string version_max;
  string version_min;
  size_type dd;
  string *version_string;
  string local_78;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCMakePolicyCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar1 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"VERSION not given an argument",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
    goto LAB_002ba77b;
  }
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_20);
  if (2 < sVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"VERSION given too many arguments",
               (allocator<char> *)((long)&version_string + 7));
    cmCommand::SetError(&this->super_cmCommand,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&version_string + 7));
    this_local._7_1_ = 0;
    goto LAB_002ba77b;
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](local_20,1);
  lVar3 = std::__cxx11::string::find((char *)pvVar2,0x8a3820);
  std::__cxx11::string::substr((ulong)((long)&version_max.field_2 + 8),(ulong)pvVar2);
  if (lVar3 == -1) {
    std::__cxx11::string::string((string *)local_d0);
LAB_002ba719:
    cmMakefile::SetPolicyVersion
              ((this->super_cmCommand).Makefile,(string *)((long)&version_max.field_2 + 8),
               (string *)local_d0);
    this_local._7_1_ = 1;
  }
  else {
    std::__cxx11::string::substr((ulong)local_d0,(ulong)pvVar2);
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0))
    goto LAB_002ba719;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
    poVar5 = std::operator<<((ostream *)local_248,"VERSION \"");
    poVar5 = std::operator<<(poVar5,(string *)pvVar2);
    std::operator<<(poVar5,"\" does not have a version on both sides of \"...\".");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_268);
    std::__cxx11::string::~string((string *)&local_268);
    this_local._7_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
  }
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(version_max.field_2._M_local_buf + 8));
LAB_002ba77b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakePolicyCommand::HandleVersionMode(
  std::vector<std::string> const& args)
{
  if (args.size() <= 1) {
    this->SetError("VERSION not given an argument");
    return false;
  }
  if (args.size() >= 3) {
    this->SetError("VERSION given too many arguments");
    return false;
  }
  std::string const& version_string = args[1];

  // Separate the <min> version and any trailing ...<max> component.
  std::string::size_type const dd = version_string.find("...");
  std::string const version_min = version_string.substr(0, dd);
  std::string const version_max = dd != std::string::npos
    ? version_string.substr(dd + 3, std::string::npos)
    : std::string();
  if (dd != std::string::npos &&
      (version_min.empty() || version_max.empty())) {
    std::ostringstream e;
    e << "VERSION \"" << version_string
      << R"(" does not have a version on both sides of "...".)";
    this->SetError(e.str());
    return false;
  }

  this->Makefile->SetPolicyVersion(version_min, version_max);
  return true;
}